

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_editor.c
# Opt level: O0

int canvas_undo_connect(_glist *x,void *z,int action)

{
  int local_20;
  int myaction;
  int action_local;
  void *z_local;
  _glist *x_local;
  
  if (action == 1) {
    local_20 = 2;
  }
  else {
    local_20 = action;
    if (action == 2) {
      local_20 = 1;
    }
  }
  canvas_undo_disconnect(x,z,local_20);
  return 1;
}

Assistant:

int canvas_undo_connect(t_canvas *x, void *z, int action)
{
    int myaction;
    if (action == UNDO_UNDO)
        myaction = UNDO_REDO;
    else if (action == UNDO_REDO)
        myaction = UNDO_UNDO;
    else myaction = action;
    canvas_undo_disconnect(x, z, myaction);
    return 1;
}